

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O0

void __thiscall agg::curve4_inc::rewind(curve4_inc *this,FILE *__stream)

{
  uint param_1_local;
  curve4_inc *this_local;
  
  if (*(int *)this == 0) {
    *(undefined4 *)(this + 4) = 0xffffffff;
  }
  else {
    *(undefined4 *)(this + 4) = *(undefined4 *)this;
    *(undefined8 *)(this + 0x30) = *(undefined8 *)(this + 0x70);
    *(undefined8 *)(this + 0x38) = *(undefined8 *)(this + 0x78);
    *(undefined8 *)(this + 0x40) = *(undefined8 *)(this + 0x80);
    *(undefined8 *)(this + 0x48) = *(undefined8 *)(this + 0x88);
    *(undefined8 *)(this + 0x50) = *(undefined8 *)(this + 0x90);
    *(undefined8 *)(this + 0x58) = *(undefined8 *)(this + 0x98);
  }
  return;
}

Assistant:

void curve4_inc::rewind(unsigned)
    {
        if(m_num_steps == 0)
        {
            m_step = -1;
            return;
        }
        m_step = m_num_steps;
        m_fx   = m_saved_fx;
        m_fy   = m_saved_fy;
        m_dfx  = m_saved_dfx;
        m_dfy  = m_saved_dfy;
        m_ddfx = m_saved_ddfx;
        m_ddfy = m_saved_ddfy;
    }